

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Vehicle *v)

{
  Person *p;
  ostream *poVar1;
  string local_40 [32];
  
  poVar1 = std::operator<<(out,"Vehicle{");
  poVar1 = std::operator<<(poVar1," type: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->type);
  poVar1 = std::operator<<(poVar1,", age: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->_age);
  poVar1 = std::operator<<(poVar1,", name: ");
  std::__cxx11::string::string(local_40,(string *)&v->_name);
  poVar1 = std::operator<<(poVar1,local_40);
  std::operator<<(poVar1,", owner: ");
  std::__cxx11::string::~string(local_40);
  p = (v->_owner)._M_t.super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
      super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
      super__Head_base<0UL,_Person_*,_false>._M_head_impl;
  if (p == (Person *)0x0) {
    std::operator<<(out,"{null}");
  }
  else {
    operator<<(out,p);
  }
  poVar1 = std::operator<<(out," }");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Vehicle& v)
  {
    out << "Vehicle{"
        << " type: " << v.type
        << ", age: " << v.age()
        << ", name: " << v.name()
        << ", owner: ";
    if (v.owner()) { out << *v.owner(); }
    else { out << "{null}"; }
    return out << " }";
  }